

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DropFaceNormalsProcess.cpp
# Opt level: O3

void __thiscall
Assimp::DropFaceNormalsProcess::Execute(DropFaceNormalsProcess *this,aiScene *pScene)

{
  aiMesh *paVar1;
  aiVector3D *paVar2;
  byte bVar3;
  byte bVar4;
  uint uVar5;
  Logger *pLVar6;
  runtime_error *this_00;
  ulong uVar7;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  pLVar6 = DefaultLogger::get();
  Logger::debug(pLVar6,"DropFaceNormalsProcess begin");
  if ((pScene->mFlags & 8) != 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_50,
               "Post-processing order mismatch: expecting pseudo-indexed (\"verbose\") vertices here"
               ,"");
    std::runtime_error::runtime_error(this_00,(string *)local_50);
    *(undefined ***)this_00 = &PTR__runtime_error_0025b8e0;
    __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  uVar5 = pScene->mNumMeshes;
  if (uVar5 != 0) {
    uVar7 = 0;
    bVar4 = 0;
    do {
      bVar3 = bVar4;
      paVar1 = pScene->mMeshes[uVar7];
      paVar2 = paVar1->mNormals;
      if (paVar2 != (aiVector3D *)0x0) {
        operator_delete__(paVar2);
        paVar1->mNormals = (aiVector3D *)0x0;
        uVar5 = pScene->mNumMeshes;
      }
      uVar7 = uVar7 + 1;
      bVar4 = bVar3 | paVar2 != (aiVector3D *)0x0;
    } while (uVar7 < uVar5);
    if ((bool)(bVar3 | paVar2 != (aiVector3D *)0x0)) {
      pLVar6 = DefaultLogger::get();
      Logger::info(pLVar6,"DropFaceNormalsProcess finished. Face normals have been removed");
      return;
    }
  }
  pLVar6 = DefaultLogger::get();
  Logger::debug(pLVar6,"DropFaceNormalsProcess finished. No normals were present");
  return;
}

Assistant:

void DropFaceNormalsProcess::Execute( aiScene* pScene) {
    ASSIMP_LOG_DEBUG("DropFaceNormalsProcess begin");

    if (pScene->mFlags & AI_SCENE_FLAGS_NON_VERBOSE_FORMAT) {
        throw DeadlyImportError("Post-processing order mismatch: expecting pseudo-indexed (\"verbose\") vertices here");
    }

    bool bHas = false;
    for( unsigned int a = 0; a < pScene->mNumMeshes; a++) {
        bHas |= this->DropMeshFaceNormals( pScene->mMeshes[a]);
    }
    if (bHas)   {
        ASSIMP_LOG_INFO("DropFaceNormalsProcess finished. "
            "Face normals have been removed");
    } else {
        ASSIMP_LOG_DEBUG("DropFaceNormalsProcess finished. "
            "No normals were present");
    }
}